

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_Explode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *t1;
  undefined8 *puVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  PClass *pPVar9;
  PClassActor *pufftype;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int fulldamagedistance;
  int iVar10;
  PClassActor *pPVar11;
  int damage;
  AActor *pAVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  uint local_84;
  FName local_64;
  double local_60;
  VMReturn *local_58;
  double local_50;
  DAngle local_48;
  DAngle local_40;
  FName local_38;
  FName local_34;
  
  pPVar9 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_00645200;
  }
  local_58 = ret;
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    t1 = (AActor *)(param->field_0).field_1.a;
    if (t1 != (AActor *)0x0) {
      if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
        (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (t1->super_DThinker).super_DObject.Class;
      bVar15 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar9 && bVar15) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar15 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar9) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar15) {
        pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00645200;
      }
    }
    pPVar9 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_00645150;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar15 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar9 && bVar15) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar15 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar9) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar15) {
          pcVar13 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00645200;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      iVar5 = -1;
      iVar4 = -1;
      if (3 < numparam) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar4 = param[3].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x569,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if (4 < numparam) {
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar5 = param[4].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x56a,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      local_84 = 1;
      if (5 < numparam) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\0') {
          local_84 = param[5].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x56b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      fulldamagedistance = 0;
      bVar15 = false;
      if (6 < numparam) {
        VVar1 = param[6].field_0.field_3.Type;
        if (VVar1 == '\0') {
          bVar15 = param[6].field_0.i != 0;
        }
        else {
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x56c,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          bVar15 = false;
        }
      }
      if (7 < numparam) {
        VVar1 = param[7].field_0.field_3.Type;
        if (VVar1 == '\0') {
          fulldamagedistance = param[7].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x56d,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      iVar14 = 0;
      if (8 < numparam) {
        VVar1 = param[8].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar14 = param[8].field_0.i;
        }
        else {
          iVar14 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x56e,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
        }
      }
      damage = 10;
      if (9 < numparam) {
        VVar1 = param[9].field_0.field_3.Type;
        if (VVar1 == '\0') {
          damage = param[9].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x56f,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((numparam < 0xb) || (VVar1 = param[10].field_0.field_3.Type, VVar1 == 0xff)) {
        local_34.Index = 0x40;
        pPVar9 = PClass::FindClass(&local_34);
        pufftype = dyn_cast<PClassActor>((DObject *)pPVar9);
      }
      else {
        if ((VVar1 != '\x03') ||
           ((param[10].field_0.field_1.atag != 1 && (param[10].field_0.field_1.a != (void *)0x0))))
        {
          pcVar13 = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
          ;
LAB_006451c2:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x570,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        pufftype = (PClassActor *)param[10].field_0.field_1.a;
        if (pufftype == (PClassActor *)0x0) {
          pufftype = (PClassActor *)0x0;
        }
        else {
          pPVar11 = pufftype;
          if (pufftype != (PClassActor *)AActor::RegistrationInfo.MyClass) {
            do {
              pPVar11 = (PClassActor *)(pPVar11->super_PClass).ParentClass;
              if (pPVar11 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar11 != (PClassActor *)0x0);
            if (pPVar11 == (PClassActor *)0x0) {
              pcVar13 = "pufftype == NULL || pufftype->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_006451c2;
            }
          }
        }
      }
      iVar10 = 0;
      if (0xb < numparam) {
        VVar1 = param[0xb].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar10 = param[0xb].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x571,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if (iVar4 < 0) {
        if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
          (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
        }
        pPVar9 = (t1->super_DThinker).super_DObject.Class;
        iVar4 = *(int *)&pPVar9[1].Defaults;
        if (pPVar9 == (PClass *)0x0) {
          iVar5 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
          (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar5);
        }
        pPVar9 = (t1->super_DThinker).super_DObject.Class;
        iVar5 = *(int *)((long)&pPVar9[1].FlatPointers + 4);
        if (pPVar9 == (PClass *)0x0) {
          iVar6 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
          (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar6);
        }
        local_84 = *(byte *)&(t1->super_DThinker).super_DObject.Class[1].FlatPointers ^ 1;
        bVar15 = false;
      }
      if (iVar5 < 1) {
        iVar5 = iVar4;
      }
      if (0 < iVar14) {
        local_50 = (double)iVar14;
        dVar3 = 0.0;
        do {
          local_40.Degrees = (dVar3 * 360.0) / local_50;
          local_48.Degrees = 0.0;
          local_64.Index = 200;
          local_60 = dVar3;
          P_LineAttack(t1,&local_40,2048.0,&local_48,damage,&local_64,pufftype,0,
                       (FTranslatedLineTarget *)0x0,(int *)0x0);
          dVar3 = local_60 + 1.0;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      if ((local_84 & 8) == 0 && iVar10 == 0) {
        iVar10 = (t1->DamageType).super_FName.Index;
      }
      pAVar12 = (t1->target).field_0.p;
      if ((pAVar12 != (AActor *)0x0) &&
         (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (t1->target).field_0.p = (AActor *)0x0;
        pAVar12 = (AActor *)0x0;
      }
      local_38.Index = iVar10;
      iVar4 = P_RadiusAttack(t1,pAVar12,iVar4,iVar5,&local_38,local_84 & 5,fulldamagedistance);
      P_CheckSplash(t1,(double)iVar5);
      if ((bVar15) && (pAVar12 = (t1->target).field_0.p, pAVar12 != (AActor *)0x0)) {
        if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (((t1->target).field_0.p)->player != (player_t *)0x0) {
            pAVar12 = (t1->target).field_0.p;
            if ((pAVar12 != (AActor *)0x0) &&
               (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (t1->target).field_0.p = (AActor *)0x0;
              pAVar12 = (AActor *)0x0;
            }
            P_NoiseAlert(pAVar12,t1,false,0.0);
          }
        }
        else {
          (t1->target).field_0.p = (AActor *)0x0;
        }
      }
      if (numret < 1) {
        iVar4 = 0;
      }
      else {
        if (local_58 == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x59b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        if (local_58->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                        ,0x118,"void VMReturn::SetInt(int)");
        }
        *(int *)local_58->Location = iVar4;
        iVar4 = 1;
      }
      return iVar4;
    }
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_00645150:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00645200:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Explode)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT	(damage)		   { damage = -1; }
	PARAM_INT_OPT	(distance)		   { distance = -1; }
	PARAM_INT_OPT	(flags)			   { flags = XF_HURTSOURCE; }
	PARAM_BOOL_OPT	(alert)			   { alert = false; }
	PARAM_INT_OPT	(fulldmgdistance)  { fulldmgdistance = 0; }
	PARAM_INT_OPT	(nails)			   { nails = 0; }
	PARAM_INT_OPT	(naildamage)	   { naildamage = 10; }
	PARAM_CLASS_OPT	(pufftype, AActor) { pufftype = PClass::FindActor(NAME_BulletPuff); }
	PARAM_NAME_OPT	(damagetype)		{ damagetype = NAME_None; }

	if (damage < 0)	// get parameters from metadata
	{
		damage = self->GetClass()->ExplosionDamage;
		distance = self->GetClass()->ExplosionRadius;
		flags = !self->GetClass()->DontHurtShooter;
		alert = false;
	}
	if (distance <= 0) distance = damage;

	// NailBomb effect, from SMMU but not from its source code: instead it was implemented and
	// generalized from the documentation at http://www.doomworld.com/eternity/engine/codeptrs.html

	if (nails)
	{
		DAngle ang;
		for (int i = 0; i < nails; i++)
		{
			ang = i*360./nails;
			// Comparing the results of a test wad with Eternity, it seems A_NailBomb does not aim
			P_LineAttack (self, ang, MISSILERANGE, 0.,
				//P_AimLineAttack (self, ang, MISSILERANGE), 
				naildamage, NAME_Hitscan, pufftype);
		}
	}

	if (!(flags & XF_NOACTORTYPE) && damagetype == NAME_None)
	{
		damagetype = self->DamageType;
	}

	int pflags = 0;
	if (flags & XF_HURTSOURCE)	pflags |= RADF_HURTSOURCE;
	if (flags & XF_NOTMISSILE)	pflags |= RADF_SOURCEISSPOT;

	int count = P_RadiusAttack (self, self->target, damage, distance, damagetype, pflags, fulldmgdistance);
	P_CheckSplash(self, distance);
	if (alert && self->target != NULL && self->target->player != NULL)
	{
		P_NoiseAlert(self->target, self);
	}
	ACTION_RETURN_INT(count);
}